

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_add_neg_y_diff_x(void)

{
  secp256k1_ge res;
  secp256k1_gej resj;
  secp256k1_ge b;
  secp256k1_gej sumj;
  secp256k1_gej bj;
  secp256k1_gej aj;
  secp256k1_gej *in_stack_fffffffffffffd28;
  secp256k1_ge *in_stack_fffffffffffffd30;
  secp256k1_gej *in_stack_fffffffffffffdb8;
  secp256k1_ge *in_stack_fffffffffffffdc0;
  undefined1 local_1c8 [112];
  secp256k1_fe *in_stack_fffffffffffffea8;
  secp256k1_ge *in_stack_fffffffffffffeb0;
  secp256k1_gej *in_stack_fffffffffffffeb8;
  secp256k1_gej *in_stack_fffffffffffffec0;
  undefined1 local_130 [8];
  secp256k1_fe *in_stack_fffffffffffffed8;
  secp256k1_gej *in_stack_fffffffffffffee0;
  secp256k1_gej *in_stack_fffffffffffffee8;
  secp256k1_gej *in_stack_fffffffffffffef0;
  secp256k1_ge *in_stack_ffffffffffffff40;
  secp256k1_gej *in_stack_ffffffffffffff48;
  secp256k1_gej *in_stack_ffffffffffffff50;
  undefined1 local_98 [152];
  
  memcpy(local_98,&DAT_0016e5c0,0x98);
  memcpy(local_130,&DAT_0016e658,0x98);
  memcpy(local_1c8,&DAT_0016e6f0,0x98);
  secp256k1_ge_set_gej(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  secp256k1_gej_add_var
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  secp256k1_ge_set_gej(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  ge_equals_gej(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  secp256k1_gej_add_ge
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  secp256k1_ge_set_gej(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  ge_equals_gej(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  secp256k1_gej_add_ge_var
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8);
  secp256k1_ge_set_gej(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  ge_equals_gej(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  return;
}

Assistant:

static void test_add_neg_y_diff_x(void) {
    /* The point of this test is to check that we can add two points
     * whose y-coordinates are negatives of each other but whose x
     * coordinates differ. If the x-coordinates were the same, these
     * points would be negatives of each other and their sum is
     * infinity. This is cool because it "covers up" any degeneracy
     * in the addition algorithm that would cause the xy coordinates
     * of the sum to be wrong (since infinity has no xy coordinates).
     * HOWEVER, if the x-coordinates are different, infinity is the
     * wrong answer, and such degeneracies are exposed. This is the
     * root of https://github.com/bitcoin-core/secp256k1/issues/257
     * which this test is a regression test for.
     *
     * These points were generated in sage as
     *
     * load("secp256k1_params.sage")
     *
     * # random "bad pair"
     * P = C.random_element()
     * Q = -int(LAMBDA) * P
     * print("    P: %x %x" % P.xy())
     * print("    Q: %x %x" % Q.xy())
     * print("P + Q: %x %x" % (P + Q).xy())
     */
    secp256k1_gej aj = SECP256K1_GEJ_CONST(
        0x8d24cd95, 0x0a355af1, 0x3c543505, 0x44238d30,
        0x0643d79f, 0x05a59614, 0x2f8ec030, 0xd58977cb,
        0x001e337a, 0x38093dcd, 0x6c0f386d, 0x0b1293a8,
        0x4d72c879, 0xd7681924, 0x44e6d2f3, 0x9190117d
    );
    secp256k1_gej bj = SECP256K1_GEJ_CONST(
        0xc7b74206, 0x1f788cd9, 0xabd0937d, 0x164a0d86,
        0x95f6ff75, 0xf19a4ce9, 0xd013bd7b, 0xbf92d2a7,
        0xffe1cc85, 0xc7f6c232, 0x93f0c792, 0xf4ed6c57,
        0xb28d3786, 0x2897e6db, 0xbb192d0b, 0x6e6feab2
    );
    secp256k1_gej sumj = SECP256K1_GEJ_CONST(
        0x671a63c0, 0x3efdad4c, 0x389a7798, 0x24356027,
        0xb3d69010, 0x278625c3, 0x5c86d390, 0x184a8f7a,
        0x5f6409c2, 0x2ce01f2b, 0x511fd375, 0x25071d08,
        0xda651801, 0x70e95caf, 0x8f0d893c, 0xbed8fbbe
    );
    secp256k1_ge b;
    secp256k1_gej resj;
    secp256k1_ge res;
    secp256k1_ge_set_gej(&b, &bj);

    secp256k1_gej_add_var(&resj, &aj, &bj, NULL);
    secp256k1_ge_set_gej(&res, &resj);
    ge_equals_gej(&res, &sumj);

    secp256k1_gej_add_ge(&resj, &aj, &b);
    secp256k1_ge_set_gej(&res, &resj);
    ge_equals_gej(&res, &sumj);

    secp256k1_gej_add_ge_var(&resj, &aj, &b, NULL);
    secp256k1_ge_set_gej(&res, &resj);
    ge_equals_gej(&res, &sumj);
}